

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O2

void solver_debug_check(solver_t *s,int result)

{
  clause_conflict *clause;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint idx;
  
  solver_debug_check_trail(s);
  idx = 0;
  fprintf(_stdout,"[Satoko] Checking clauses (%d)... \n",(ulong)s->originals->size);
  while( true ) {
    if (s->originals->size <= idx) {
      fwrite("[Satoko] All SAT - OK\n",0x16,1,_stdout);
      return;
    }
    uVar1 = vec_uint_at(s->originals,idx);
    clause = (clause_conflict *)(s->all_clauses->data + uVar1);
    uVar1 = clause->size;
    uVar3 = 0;
    while ((uVar4 = (ulong)uVar1, uVar1 != uVar3 &&
           (uVar2 = vec_uint_find(s->trail,*(uint *)(&clause[1].field_0x0 + uVar3 * 4)),
           uVar4 = uVar3, uVar2 == 0))) {
      uVar3 = uVar3 + 1;
    }
    if ((result == 1) && ((uint)uVar4 == uVar1)) break;
    idx = idx + 1;
  }
  fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE: (%d) ",(ulong)idx);
  clause_print(clause);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                ,0x2fd,"void solver_debug_check(solver_t *, int)");
}

Assistant:

void solver_debug_check(solver_t *s, int result)
{
    unsigned cref, i;
    solver_debug_check_trail(s);
    fprintf(stdout, "[Satoko] Checking clauses (%d)... \n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, clause->data[j].lit)) {
                break;
            }
        }
        if (result == SATOKO_SAT && j == clause->size) {
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}